

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::MergePartialFromCodedStream
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  double *pdVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  double in_RAX;
  int iVar8;
  ulong uVar9;
  int iVar10;
  pair<unsigned_long,_bool> pVar11;
  double local_38;
  
  local_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003cbcc4;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003cbcc4:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    iVar10 = 6;
    iVar8 = iVar10;
    if ((uVar9 & 0x100000000) == 0) {
LAB_003cbd46:
      iVar8 = 7;
      if (((uVar6 & 7) != 4 && uVar6 != 0) &&
         (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar8 = iVar10
         , bVar5)) {
LAB_003cbd6b:
        iVar8 = 0;
      }
    }
    else {
      uVar7 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar9 == '\x11') {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                              (input,(uint64 *)&local_38);
            if (!bVar5) goto LAB_003cbd6d;
          }
          else {
            local_38 = *pdVar4;
            input->buffer_ = (uint8 *)(pdVar4 + 1);
          }
          this->evaluationvalue_ = local_38;
          goto LAB_003cbd6b;
        }
        goto LAB_003cbd46;
      }
      if ((uVar7 != 1) || ((char)uVar9 != '\b')) goto LAB_003cbd46;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (-1 < (long)(char)*puVar3)) {
        this->evaluationindex_ = (long)(char)*puVar3;
        input->buffer_ = puVar3 + 1;
        goto LAB_003cbd6b;
      }
      pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->evaluationindex_ = pVar11.first;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_003cbd6b;
    }
LAB_003cbd6d:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleParameters_TreeNode_EvaluationInfo::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 evaluationIndex = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &evaluationindex_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double evaluationValue = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(17u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &evaluationvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  return false;
#undef DO_
}